

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxRouter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  CDesign CurrentDesign;
  
  puts("*****************************************");
  puts("*             BoxRouter 2.0             *");
  puts("*           (ICCAD07 version)           *");
  puts("*                                       *");
  puts("*     Minsik Cho     Dr. David Pan      *");
  puts("*      Kun Yuan        Katrina Lu       *");
  puts("*    UT Design Automation Laboratory    *");
  puts("*   The University of Texas at Austin   *");
  puts("*       www.cerc.utexas.edu/utda        *");
  puts("*****************************************");
  if (argc < 2) {
    CObject::Display(1,"parameter file is missing\n");
  }
  CDesign::CDesign(&CurrentDesign);
  StopWatch(1);
  iVar1 = CDesign::Initialize(&CurrentDesign,argv[1]);
  if (iVar1 != 0) {
    CGRouter::Routing(&CurrentDesign);
    CDesign::Report(&CurrentDesign,argv[1]);
    CDesign::PrintResult(&CurrentDesign);
  }
  CDesign::~CDesign(&CurrentDesign);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	printf("*****************************************\n");
	printf("*             BoxRouter 2.0             *\n");
//	printf("*            (ISPD07 version)           *\n");
	printf("*           (ICCAD07 version)           *\n");
	printf("*                                       *\n");
	printf("*     Minsik Cho     Dr. David Pan      *\n");
	printf("*      Kun Yuan        Katrina Lu       *\n");
	printf("*    UT Design Automation Laboratory    *\n");
	printf("*   The University of Texas at Austin   *\n");
	printf("*       www.cerc.utexas.edu/utda        *\n");  
	printf("*****************************************\n");

	if(argc<2)	CDesign::Display(DISPLAY_MODE_ERRO,"parameter file is missing\n");

	CDesign	CurrentDesign;	
	StopWatch(STOPWATCH_OPTION_RESET);

	if(CurrentDesign.Initialize(argv[1]))
	{
		CGRouter::Routing(&CurrentDesign);
		CurrentDesign.Report(argv[1]);
		CurrentDesign.PrintResult();
	}

	return 0;
}